

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

bool __thiscall
pybind11::detail::argument_loader<sdf_tools::real3_const&,unsigned_long>::
load_impl_sequence<0ul,1ul>(void *param_1,long param_2)

{
  handle src;
  handle src_00;
  bool bVar1;
  type_caster_generic *this;
  reference pvVar2;
  undefined1 uVar3;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  byte bVar4;
  _Bit_reference in_stack_ffffffffffffffb8;
  reference local_30;
  PyObject *local_20;
  type_caster<unsigned_long,_void> *this_00;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  this_00 = (type_caster<unsigned_long,_void> *)param_1;
  this = (type_caster_generic *)
         std::
         get<0ul,pybind11::detail::type_caster<sdf_tools::real3,void>,pybind11::detail::type_caster<unsigned_long,void>>
                   ((tuple<pybind11::detail::type_caster<sdf_tools::real3,_void>,_pybind11::detail::type_caster<unsigned_long,_void>_>
                     *)0x1a99ed);
  uVar3 = (undefined1)((ulong)param_1 >> 0x38);
  pvVar2 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)(param_2 + 8),0
                     );
  local_20 = pvVar2->m_ptr;
  local_30 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)in_stack_ffffffffffffffb8._M_mask,
                        (size_type)in_stack_ffffffffffffffb8._M_p);
  std::_Bit_reference::operator_cast_to_bool(&local_30);
  src.m_ptr._7_1_ = in_stack_ffffffffffffffb7;
  src.m_ptr._0_7_ = in_stack_ffffffffffffffb0;
  bVar1 = type_caster_generic::load(this,src,(bool)uVar3);
  bVar4 = 1;
  if (bVar1) {
    std::
    get<1ul,pybind11::detail::type_caster<sdf_tools::real3,void>,pybind11::detail::type_caster<unsigned_long,void>>
              ((tuple<pybind11::detail::type_caster<sdf_tools::real3,_void>,_pybind11::detail::type_caster<unsigned_long,_void>_>
                *)0x1a9a60);
    std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
              ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)(param_2 + 8),1);
    uVar3 = (undefined1)((ulong)param_2 >> 0x38);
    std::vector<bool,_std::allocator<bool>_>::operator[]
              ((vector<bool,_std::allocator<bool>_> *)in_stack_ffffffffffffffb8._M_mask,
               (size_type)in_stack_ffffffffffffffb8._M_p);
    std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&stack0xffffffffffffffb8);
    src_00.m_ptr._7_1_ = in_stack_ffffffffffffffff;
    src_00.m_ptr._0_7_ = in_stack_fffffffffffffff8;
    bVar1 = type_caster<unsigned_long,_void>::load(this_00,src_00,(bool)uVar3);
    bVar4 = bVar1 ^ 0xff;
  }
  return (bVar4 & 1) == 0;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
#ifdef __cpp_fold_expressions
        if ((... || !std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])))
            return false;
#else
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
#endif
        return true;
    }